

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

bool __thiscall
SQVM::InvokeDefaultDelegate(SQVM *this,SQObjectPtr *self,SQObjectPtr *key,SQObjectPtr *dest)

{
  SQObjectType SVar1;
  bool bVar2;
  long lVar3;
  
  SVar1 = (self->super_SQObject)._type;
  if (((SVar1 == OT_BOOL) || (SVar1 == OT_INTEGER)) || (SVar1 == OT_FLOAT)) {
    lVar3 = 0xd8;
  }
  else if (SVar1 == OT_STRING) {
    lVar3 = 200;
  }
  else if (SVar1 == OT_ARRAY) {
    lVar3 = 0xb8;
  }
  else if ((SVar1 == OT_CLOSURE) || (SVar1 == OT_NATIVECLOSURE)) {
    lVar3 = 0xf8;
  }
  else if (SVar1 == OT_GENERATOR) {
    lVar3 = 0xe8;
  }
  else if (SVar1 == OT_THREAD) {
    lVar3 = 0x108;
  }
  else if (SVar1 == OT_CLASS) {
    lVar3 = 0x118;
  }
  else if (SVar1 == OT_WEAKREF) {
    lVar3 = 0x138;
  }
  else if (SVar1 == OT_INSTANCE) {
    lVar3 = 0x128;
  }
  else {
    if (SVar1 != OT_TABLE) {
      return false;
    }
    lVar3 = 0xa8;
  }
  bVar2 = SQTable::Get(*(SQTable **)((long)&this->_sharedstate->_metamethods + lVar3),key,dest);
  return bVar2;
}

Assistant:

bool SQVM::InvokeDefaultDelegate(const SQObjectPtr &self,const SQObjectPtr &key,SQObjectPtr &dest)
{
    SQTable *ddel = NULL;
    switch(type(self)) {
        case OT_CLASS: ddel = _class_ddel; break;
        case OT_TABLE: ddel = _table_ddel; break;
        case OT_ARRAY: ddel = _array_ddel; break;
        case OT_STRING: ddel = _string_ddel; break;
        case OT_INSTANCE: ddel = _instance_ddel; break;
        case OT_INTEGER:case OT_FLOAT:case OT_BOOL: ddel = _number_ddel; break;
        case OT_GENERATOR: ddel = _generator_ddel; break;
        case OT_CLOSURE: case OT_NATIVECLOSURE: ddel = _closure_ddel; break;
        case OT_THREAD: ddel = _thread_ddel; break;
        case OT_WEAKREF: ddel = _weakref_ddel; break;
        default: return false;
    }
    return  ddel->Get(key,dest);
}